

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void write_png_file(char *filename,int width,int height,uchar *pixels,Color *palette)

{
  uint code;
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> png;
  State state;
  allocator local_289;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  char *local_268;
  string local_260;
  State local_240;
  
  local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = filename;
  lodepng::State::State(&local_240);
  local_240.super_LodePNGState.info_raw.colortype = LCT_PALETTE;
  local_240.super_LodePNGState.info_raw.bitdepth = 8;
  lVar3 = 2;
  do {
    lodepng_palette_add(&local_240.super_LodePNGState.info_raw,
                        *(uchar *)((long)palette + lVar3 + -2),
                        *(uchar *)((long)palette + lVar3 + -1),(&palette->red)[lVar3],0xff);
    lVar3 = lVar3 + 3;
  } while (lVar3 != 0x32);
  code = lodepng::encode(&local_288,pixels,width,height,&local_240);
  if (code == 0) {
    std::__cxx11::string::string((string *)&local_260,local_268,&local_289);
    lodepng::save_file(&local_288,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[write_png_file] encoder error ",0x1f);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    __s = lodepng_error_text(code);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  lodepng::State::~State(&local_240);
  if (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void write_png_file(const char *filename, int width, int height, const unsigned char *pixels, Color *palette) {
    std::vector<unsigned char> png;
    lodepng::State state;
    state.info_raw.colortype = LCT_PALETTE;
    state.info_raw.bitdepth = 8;

    for (int i = 0; i < MAX_COLOURS; i++) {
        lodepng_palette_add(
                &state.info_raw,
                palette[i].red,
                palette[i].green,
                palette[i].blue,
                0xFF
        );
    }
    unsigned error = lodepng::encode(png, pixels, (unsigned )width, (unsigned )height, state);
    if(!error) lodepng::save_file(png, filename);
    if (error) {
        std::cout << "[write_png_file] encoder error " << error << ": "<< lodepng_error_text(error) << std::endl;
    }
}